

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::executor_function_tag>
                 (long param_1,long param_2,size_t param_3)

{
  ulong uVar1;
  void *pointer;
  void *__ptr;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  long lStack_30;
  
  uVar1 = param_2 + 3;
  if (param_1 != 0) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      pbVar2 = *(byte **)(param_1 + 0x20 + lVar3 * 8);
      if (((pbVar2 != (byte *)0x0) && (uVar1 >> 2 <= (ulong)*pbVar2)) &&
         ((ulong)pbVar2 % param_3 == 0)) {
        *(undefined8 *)(param_1 + 0x20 + lVar3 * 8) = 0;
        bVar4 = *pbVar2;
        goto LAB_00244d80;
      }
    }
    __ptr = *(void **)(param_1 + 0x20);
    if (__ptr == (void *)0x0) {
      __ptr = *(void **)(param_1 + 0x28);
      if (__ptr == (void *)0x0) goto LAB_00244d5e;
      lStack_30 = 5;
    }
    else {
      lStack_30 = 4;
    }
    *(undefined8 *)(param_1 + lStack_30 * 8) = 0;
    free(__ptr);
  }
LAB_00244d5e:
  pbVar2 = (byte *)aligned_new(param_3,(uVar1 & 0xfffffffffffffffc) + 1);
  bVar4 = (byte)(uVar1 >> 2);
  if (0x3ff < uVar1) {
    bVar4 = 0;
  }
LAB_00244d80:
  pbVar2[param_2] = bVar4;
  return pbVar2;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }